

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-walk.c
# Opt level: O1

ztresult_t
zt_walk(ztstruct_t *metastruct,void *structure,ztregion_t *regions,int nregions,
       ztwalkhandlers_t *walkhandlers,void *opaque)

{
  int iVar1;
  ztarray *pzVar2;
  void *pvVar3;
  void *pvVar4;
  int iVar5;
  ztresult_t zVar6;
  ztresult_t zVar7;
  ulong uVar8;
  ztregion_t *pzVar9;
  ulong uVar10;
  long lVar11;
  ztuchar_t *pvalue;
  ulong *structure_00;
  char *pcVar12;
  ztstruct *metastruct_00;
  ztresult_t in_R11D;
  ztfield_t *pzVar13;
  bool bVar14;
  
  if (metastruct->nfields < 1) {
    return 0;
  }
  pzVar13 = metastruct->fields;
LAB_00102ab2:
  iVar5 = pzVar13->stride;
  if (iVar5 == 0) {
    iVar5 = pzVar13->nelems;
  }
  if (zttype_custom < pzVar13->type) {
    in_R11D = 0x60;
    goto LAB_00102f3b;
  }
  structure_00 = (ulong *)(pzVar13->offset + (long)structure);
  switch(pzVar13->type) {
  case zttype_uchar:
    pcVar12 = pzVar13->name;
    iVar1 = pzVar13->nelems;
    goto LAB_00102bed;
  case zttype_ucharptr:
    structure_00 = (ulong *)*structure_00;
    pcVar12 = pzVar13->name;
    iVar1 = pzVar13->nelems;
LAB_00102bed:
    iVar5 = (*walkhandlers->uchar)(pcVar12,(ztuchar_t *)structure_00,(long)iVar1,(long)iVar5,opaque)
    ;
    break;
  case zttype_ushort:
    pcVar12 = pzVar13->name;
    iVar1 = pzVar13->nelems;
    goto LAB_00102b9b;
  case zttype_ushortptr:
    structure_00 = (ulong *)*structure_00;
    pcVar12 = pzVar13->name;
    iVar1 = pzVar13->nelems;
LAB_00102b9b:
    iVar5 = (*walkhandlers->ushort)
                      (pcVar12,(ztushort_t *)structure_00,(long)iVar1,(long)iVar5,opaque);
    break;
  case zttype_uint:
    pcVar12 = pzVar13->name;
    iVar1 = pzVar13->nelems;
    goto LAB_00102c09;
  case zttype_uintptr:
    structure_00 = (ulong *)*structure_00;
    pcVar12 = pzVar13->name;
    iVar1 = pzVar13->nelems;
LAB_00102c09:
    iVar5 = (*walkhandlers->uint)(pcVar12,(ztuint_t *)structure_00,(long)iVar1,(long)iVar5,opaque);
    break;
  case zttype_struct:
    if (pzVar13->nelems != 1) {
      zVar6 = (*walkhandlers->startarray)(pzVar13->name,pzVar13->nelems,opaque);
      if (zVar6 != 0) goto LAB_00102da5;
      if (0 < pzVar13->nelems) {
        lVar11 = 0;
        do {
          zVar6 = (*walkhandlers->startstruct)((char *)0x0,opaque);
          if (((zVar6 != 0) ||
              (zVar6 = zt_walk(pzVar13->metadata,
                               (ulong *)(pzVar13->size * lVar11 + (long)structure_00),regions,
                               nregions,walkhandlers,opaque), zVar6 != 0)) ||
             (zVar6 = (*walkhandlers->endstruct)(opaque), zVar6 != 0)) goto LAB_00102f06;
          lVar11 = lVar11 + 1;
        } while (lVar11 < pzVar13->nelems);
      }
LAB_00102e96:
      zVar6 = (*walkhandlers->endarray)(opaque);
      bVar14 = zVar6 == 0;
      if (!bVar14) {
        in_R11D = zVar6;
      }
      goto LAB_00102f13;
    }
    zVar6 = (*walkhandlers->startstruct)(pzVar13->name,opaque);
    if (zVar6 != 0) {
LAB_00102c59:
      in_R11D = zVar6;
      bVar14 = false;
      goto LAB_00102f37;
    }
    metastruct_00 = pzVar13->metadata;
LAB_00102c40:
    zVar6 = zt_walk(metastruct_00,structure_00,regions,nregions,walkhandlers,opaque);
    if (zVar6 != 0) goto LAB_00102c59;
    zVar6 = (*walkhandlers->endstruct)(opaque);
    if (zVar6 != 0) {
      bVar14 = false;
      in_R11D = zVar6;
      goto LAB_00102f37;
    }
    goto LAB_00102f27;
  case zttype_structptr:
    if (pzVar13->nelems == 1) {
      zVar6 = (*walkhandlers->startstruct)(pzVar13->name,opaque);
      if (zVar6 == 0) {
        metastruct_00 = pzVar13->metadata;
        structure_00 = (ulong *)*structure_00;
        goto LAB_00102c40;
      }
      goto LAB_00102c59;
    }
    zVar6 = (*walkhandlers->startarray)(pzVar13->name,pzVar13->nelems,opaque);
    if (zVar6 == 0) {
      if (0 < pzVar13->nelems) {
        lVar11 = 0;
        do {
          zVar6 = (*walkhandlers->startstruct)((char *)0x0,opaque);
          if (((zVar6 != 0) ||
              (zVar6 = zt_walk(pzVar13->metadata,(void *)structure_00[lVar11],regions,nregions,
                               walkhandlers,opaque), zVar6 != 0)) ||
             (zVar6 = (*walkhandlers->endstruct)(opaque), zVar6 != 0)) goto LAB_00102f06;
          lVar11 = lVar11 + 1;
        } while ((int)lVar11 < pzVar13->nelems);
      }
      goto LAB_00102e96;
    }
LAB_00102da5:
    bVar14 = false;
    in_R11D = zVar6;
    goto LAB_00102f13;
  case zttype_staticarrayidx:
    if (pzVar13->nelems == 1) {
      pvVar3 = (void *)*structure_00;
      if (pvVar3 == (void *)0x0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        pzVar2 = pzVar13->array;
        pvVar4 = pzVar2->base;
        if ((void *)((long)pvVar4 + pzVar2->length) <= pvVar3 || pvVar3 < pvVar4) {
          in_R11D = 0x80;
          goto LAB_00102ee3;
        }
        uVar8 = (ulong)((long)pvVar3 - (long)pvVar4) /
                (pzVar2->length / (ulong)(long)pzVar2->nelems);
      }
      zVar6 = (*walkhandlers->index)(pzVar13->name,uVar8,opaque);
      bVar14 = zVar6 == 0;
      if (!bVar14) {
        in_R11D = zVar6;
      }
    }
    else {
      in_R11D = 0x90;
LAB_00102ee3:
      bVar14 = false;
    }
    goto LAB_00102f37;
  case zttype_arrayidx:
    bVar14 = false;
    if (pzVar13->nelems == 1) {
      uVar8 = 0;
      if (0 < nregions) {
        uVar10 = 0;
        pzVar9 = regions;
        do {
          uVar8 = uVar10;
          if (pzVar9->id == pzVar13->regionid) break;
          uVar10 = uVar10 + 1;
          pzVar9 = pzVar9 + 1;
          uVar8 = (ulong)(uint)nregions;
        } while ((uint)nregions != uVar10);
      }
      if ((int)uVar8 == nregions) {
        bVar14 = false;
        zVar6 = 0x20;
      }
      else {
        pvVar3 = (void *)*structure_00;
        if (pvVar3 == (void *)0x0) {
          uVar8 = 0xffffffffffffffff;
        }
        else {
          uVar8 = uVar8 & 0xffffffff;
          pvVar4 = regions[uVar8].spec.base;
          bVar14 = false;
          zVar6 = 0x80;
          if ((pvVar3 < pvVar4) ||
             (uVar10 = regions[uVar8].spec.length, (void *)((long)pvVar4 + uVar10) <= pvVar3))
          goto LAB_00102f64;
          uVar8 = (ulong)((long)pvVar3 - (long)pvVar4) /
                  (uVar10 / (ulong)(long)regions[uVar8].spec.nelems);
        }
        zVar7 = (*walkhandlers->index)(pzVar13->name,uVar8,opaque);
        bVar14 = zVar7 == 0;
        zVar6 = in_R11D;
        if (!bVar14) {
          zVar6 = zVar7;
        }
      }
    }
    else {
      zVar6 = 0x90;
    }
LAB_00102f64:
    in_R11D = zVar6;
    if (bVar14) goto LAB_00102f6b;
    bVar14 = false;
    goto LAB_00102f6d;
  case zttype_version:
    iVar5 = (*walkhandlers->version)(pzVar13->name,(ztversion_t)*structure_00,opaque);
    break;
  case zttype_custom:
    iVar5 = (*walkhandlers->custom)(pzVar13->name,pzVar13->typeidx,structure_00,opaque);
  }
  if (iVar5 == 0) goto LAB_00102f6b;
  bVar14 = false;
  in_R11D = iVar5;
  goto LAB_00102f6d;
LAB_00102f06:
  bVar14 = false;
  in_R11D = zVar6;
LAB_00102f13:
  if (bVar14) {
LAB_00102f27:
    bVar14 = true;
  }
  else {
    bVar14 = false;
  }
LAB_00102f37:
  if (bVar14) {
LAB_00102f6b:
    bVar14 = true;
  }
  else {
LAB_00102f3b:
    bVar14 = false;
  }
LAB_00102f6d:
  if (!bVar14) {
    return in_R11D;
  }
  pzVar13 = pzVar13 + 1;
  if (metastruct->fields + metastruct->nfields <= pzVar13) {
    return 0;
  }
  goto LAB_00102ab2;
}

Assistant:

ztresult_t zt_walk(const ztstruct_t       *metastruct,
                   const void             *structure,
                   const ztregion_t       *regions,
                   int                     nregions,
                   const ztwalkhandlers_t *walkhandlers,
                   void                   *opaque)
{
  int              rc;
  const ztfield_t *f;

  for (f = &metastruct->fields[0]; f < &metastruct->fields[metastruct->nfields]; f++)
  {
    const void *rawvalue = (const char *) structure + f->offset;
    int         stride   = (f->stride == ZT_NO_STRIDE) ? f->nelems : f->stride;

    switch (f->type)
    {
    case zttype_uchar:
      {
        const ztuchar_t *pvalue = rawvalue;
        rc = walkhandlers->uchar(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ucharptr:
      {
        const ztuchar_t **ppdata = (const ztuchar_t **) rawvalue;
        const ztuchar_t  *pvalue = *ppdata;
        rc = walkhandlers->uchar(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ushort:
      {
        const ztushort_t *pvalue = rawvalue;
        rc = walkhandlers->ushort(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ushortptr:
      {
        const ztushort_t **ppdata = (const ztushort_t **) rawvalue;
        const ztushort_t  *pvalue = *ppdata;
        rc = walkhandlers->ushort(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_uint:
      {
        const ztuint_t *pvalue = rawvalue;
        rc = walkhandlers->uint(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_uintptr:
      {
        const ztuint_t **ppdata = (const ztuint_t **) rawvalue;
        const ztuint_t  *pvalue = *ppdata;
        rc = walkhandlers->uint(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_struct:
      {
        const void *pstruct = rawvalue;

        if (f->nelems == 1)
        {
          rc = walkhandlers->startstruct(f->name, opaque);
          if (rc)
            return rc;

          rc = zt_walk(f->metadata,
                       pstruct,
                       regions,
                       nregions,
                       walkhandlers,
                       opaque);
          if (rc)
            return rc;

          rc = walkhandlers->endstruct(opaque);
          if (rc)
            return rc;
        }
        else
        {
          int i;

          rc = walkhandlers->startarray(f->name, f->nelems, opaque);
          if (rc)
            return rc;

          for (i = 0; i < f->nelems; i++)
          {
            rc = walkhandlers->startstruct(NULL /* name */, opaque);
            if (rc)
              return rc;

            rc = zt_walk(f->metadata,
                         (char *) pstruct + i * f->size,
                         regions,
                         nregions,
                         walkhandlers,
                         opaque);
            if (rc)
              return rc;

            rc = walkhandlers->endstruct(opaque);
            if (rc)
              return rc;
          }

          rc = walkhandlers->endarray(opaque);
          if (rc)
            return rc;
        }
        break;
      }

    case zttype_structptr:
      {
        const unsigned char **ppstruct = (const unsigned char **) rawvalue;

        if (f->nelems == 1)
        {
          rc = walkhandlers->startstruct(f->name, opaque);
          if (rc)
            return rc;

          rc = zt_walk(f->metadata,
                       *ppstruct,
                       regions,
                       nregions,
                       walkhandlers,
                       opaque);
          if (rc)
            return rc;

          rc = walkhandlers->endstruct(opaque);
          if (rc)
            return rc;
        }
        else
        {
          int j;

          rc = walkhandlers->startarray(f->name, f->nelems, opaque);
          if (rc)
            return rc;

          for (j = 0; j < f->nelems; j++)
          {
            rc = walkhandlers->startstruct(NULL, opaque);
            if (rc)
              return rc;

            rc = zt_walk(f->metadata,
                         *ppstruct++,
                         regions,
                         nregions,
                         walkhandlers,
                         opaque);
            if (rc)
              return rc;

            rc = walkhandlers->endstruct(opaque);
            if (rc)
              return rc;
          }

          rc = walkhandlers->endarray(opaque);
          if (rc)
            return rc;
        }
        break;
      }

    case zttype_staticarrayidx:
      {
        const ztarray_t *array;
        const char      *base;
        const char      *end;
        const char      *pp;
        const char      *ptr;
        unsigned long    index;

        if (f->nelems != 1)
          return ztresult_BAD_FIELD;

        array = f->array;
        base  = array->base;
        end   = (const char *) array->base + array->length;
        pp    = (const char *) structure + f->offset;
        ptr   = *((const char **) pp);

        if (ptr == NULL)
        {
          index = ULONG_MAX;
        }
        else
        {
          if (ptr < base || ptr >= end)
            return ztresult_BAD_POINTER;

          index = (ptr - base) / (array->length / array->nelems);
        }
        rc = walkhandlers->index(f->name, index, opaque);
        if (rc)
          return rc;

        break;
      }

    case zttype_arrayidx:
      {
        int                   r;
        const ztarray_t      *array;
        const char           *base;
        const char           *end;
        const unsigned char **pp;
        const char           *ptr;
        unsigned long         index;

        if (f->nelems != 1)
          return ztresult_BAD_FIELD;

        /* find f->regionid in regions[] */
        for (r = 0; r < nregions; r++)
          if (regions[r].id == f->regionid)
            break;

        if (r == nregions)
          return ztresult_UNKNOWN_REGION;

        /* use the array spec to turn it into an index */
        array = &regions[r].spec;
        base  = array->base;
        end   = (const char *) array->base + array->length;
        pp    = (const unsigned char **) rawvalue;
        ptr   = *((const char **) pp);

        if (ptr == NULL)
        {
          index = ULONG_MAX;
        }
        else
        {
          if (ptr < base || ptr >= end)
            return ztresult_BAD_POINTER;

          index = (ptr - base) / (array->length / array->nelems);
        }
        rc = walkhandlers->index(f->name, index, opaque);
        if (rc)
          return rc;

        break;
      }

    case zttype_version:
      {
        const ztversion_t *pvalue = rawvalue;
        rc = walkhandlers->version(f->name, *pvalue, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_custom:
      {
        const void *pvalue = rawvalue;
        rc = walkhandlers->custom(f->name, f->typeidx, pvalue, opaque);
        if (rc)
          return rc;
        break;
      }

    default:
      return ztresult_UNKNOWN_TYPE;
    }
  }

  return ztresult_OK;
}